

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O0

uint64 mkvmuxer::WriteVoidElement(IMkvWriter *writer,uint64 size)

{
  int32 iVar1;
  int32 iVar2;
  int iVar3;
  uint64 uVar4;
  long lVar5;
  IMkvWriter *in_RSI;
  long *in_RDI;
  int64 stop_position;
  int32 i;
  uint8 value;
  int64 payload_position;
  uint64 void_size;
  uint64 void_entry_size;
  undefined1 *value_00;
  uint64 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar6;
  undefined4 in_stack_ffffffffffffffcc;
  IMkvWriter *local_8;
  
  if (in_RDI == (long *)0x0) {
    local_8 = (IMkvWriter *)0x0;
  }
  else {
    value_00 = (undefined1 *)((long)&in_RSI[-1]._vptr_IMkvWriter + 7);
    iVar1 = GetCodedUIntSize((uint64)((long)&in_RSI[-1]._vptr_IMkvWriter + 7));
    uVar4 = EbmlMasterElementSize(in_stack_ffffffffffffffc0,(uint64)value_00);
    local_8 = (IMkvWriter *)(uVar4 + ((long)value_00 - (long)iVar1));
    if (local_8 == in_RSI) {
      uVar4 = (**(code **)(*in_RDI + 8))();
      if ((long)uVar4 < 0) {
        local_8 = (IMkvWriter *)0x0;
      }
      else {
        iVar2 = WriteID(local_8,uVar4);
        if (iVar2 == 0) {
          iVar2 = WriteUInt((IMkvWriter *)
                            CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                            in_stack_ffffffffffffffc0);
          if (iVar2 == 0) {
            for (iVar6 = 0; iVar6 < (int)((long)value_00 - (long)iVar1); iVar6 = iVar6 + 1) {
              iVar3 = (**(code **)*in_RDI)(in_RDI,&stack0xffffffffffffffcf,1);
              if (iVar3 != 0) {
                return 0;
              }
            }
            lVar5 = (**(code **)(*in_RDI + 8))();
            if ((lVar5 < 0) || ((IMkvWriter *)(lVar5 - uVar4) != local_8)) {
              local_8 = (IMkvWriter *)0x0;
            }
          }
          else {
            local_8 = (IMkvWriter *)0x0;
          }
        }
        else {
          local_8 = (IMkvWriter *)0x0;
        }
      }
    }
    else {
      local_8 = (IMkvWriter *)0x0;
    }
  }
  return (uint64)local_8;
}

Assistant:

uint64 WriteVoidElement(IMkvWriter* writer, uint64 size) {
  if (!writer)
    return false;

  // Subtract one for the void ID and the coded size.
  uint64 void_entry_size = size - 1 - GetCodedUIntSize(size - 1);
  uint64 void_size = EbmlMasterElementSize(libwebm::kMkvVoid, void_entry_size) +
                     void_entry_size;

  if (void_size != size)
    return 0;

  const int64 payload_position = writer->Position();
  if (payload_position < 0)
    return 0;

  if (WriteID(writer, libwebm::kMkvVoid))
    return 0;

  if (WriteUInt(writer, void_entry_size))
    return 0;

  const uint8 value = 0;
  for (int32 i = 0; i < static_cast<int32>(void_entry_size); ++i) {
    if (writer->Write(&value, 1))
      return 0;
  }

  const int64 stop_position = writer->Position();
  if (stop_position < 0 ||
      stop_position - payload_position != static_cast<int64>(void_size))
    return 0;

  return void_size;
}